

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

void * __thiscall dgMeshEffect::GetNextVertex(dgMeshEffect *this,void *vertex)

{
  int iVar1;
  int iVar2;
  dgRedBackNode *pdVar3;
  dgRedBackNode *pdVar4;
  Iterator iter;
  Iterator local_28;
  
  iVar1 = *(int *)((long)vertex + 0x50);
  pdVar3 = (dgRedBackNode *)0x0;
  local_28.m_ptr = (dgRedBackNode *)vertex;
  local_28.m_tree = (dgTree<dgEdge,_long> *)this;
  dgTree<dgEdge,_long>::Iterator::operator++(&local_28,0);
  while( true ) {
    if (local_28.m_ptr == (dgRedBackNode *)0x0) {
      return (void *)0x0;
    }
    iVar2 = *(int *)&local_28.m_ptr[2]._vptr_dgRedBackNode;
    if (iVar2 != iVar1) {
      pdVar4 = local_28.m_ptr + 1;
      do {
        *(int *)&pdVar4[1]._vptr_dgRedBackNode = iVar1;
        pdVar4 = *(dgRedBackNode **)(*(long *)&pdVar4->field_0x20 + 0x10);
        pdVar3 = local_28.m_ptr;
      } while (pdVar4 != local_28.m_ptr + 1);
    }
    if (iVar2 != iVar1) break;
    dgTree<dgEdge,_long>::Iterator::operator++(&local_28,0);
  }
  return pdVar3;
}

Assistant:

void* dgMeshEffect::GetNextVertex (const void* const vertex)
{
	dgTreeNode* node = (dgTreeNode*) vertex;
	hacd::HaI32 mark = node->GetInfo().m_mark;

	Iterator iter (*this);
	iter.Set (node);
	for (iter ++; iter; iter ++) {
		dgTreeNode* node = iter.GetNode();
		if (node->GetInfo().m_mark != mark) {
			dgEdge* const edge = &node->GetInfo();
			dgEdge* ptr = edge;
			do {
				ptr->m_mark = mark;
				ptr = ptr->m_twin->m_next;
			} while (ptr != edge);
			return node; 
		}
	}
	return NULL; 
}